

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_face_load_sbit(TT_Face face,FT_Stream stream)

{
  FT_Byte **pbytes;
  uint *puVar1;
  bool bVar2;
  FT_UShort FVar3;
  FT_UShort FVar4;
  FT_Error FVar5;
  FT_Error FVar6;
  FT_ULong FVar7;
  FT_ULong FVar8;
  uint uVar9;
  TT_SbitTableType TVar10;
  ulong count;
  ulong uVar11;
  FT_ULong table_size;
  FT_ULong ebdt_size;
  ulong local_48;
  FT_ULong local_40;
  ulong local_38;
  
  face->sbit_table = (FT_Byte *)0x0;
  face->sbit_table_size = 0;
  face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
  face->sbit_num_strikes = 0;
  FVar5 = (*face->goto_table)(face,0x43424c43,stream,&local_48);
  if (FVar5 == 0) {
    TVar10 = TT_SBIT_TABLE_TYPE_CBLC;
LAB_00161782:
    face->sbit_table_type = TVar10;
    FVar5 = 0;
  }
  else {
    FVar5 = (*face->goto_table)(face,0x45424c43,stream,&local_48);
    TVar10 = TT_SBIT_TABLE_TYPE_EBLC;
    if ((FVar5 == 0) || (FVar5 = (*face->goto_table)(face,0x626c6f63,stream,&local_48), FVar5 == 0))
    goto LAB_00161782;
    FVar5 = (*face->goto_table)(face,0x73626978,stream,&local_48);
    if (FVar5 == 0) {
      TVar10 = TT_SBIT_TABLE_TYPE_SBIX;
      goto LAB_00161782;
    }
  }
  pbytes = &face->sbit_table;
  if ((FVar5 != 0) || (FVar5 = 3, local_48 < 8)) goto LAB_001617a1;
  FVar7 = FT_Stream_Pos(stream);
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    FVar5 = FT_Stream_ExtractFrame(stream,local_48,pbytes);
    if (FVar5 == 0) {
      face->sbit_table_size = local_48;
      puVar1 = (uint *)face->sbit_table;
      uVar9 = *puVar1;
      if ((((uVar9 & 0xff00) << 8 | uVar9 << 0x18 | 0x10000) == 0x30000) ||
         ((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | 0x100) == 0x300)) {
        if (*(char *)((long)puVar1 + 5) == '\0' && (char)puVar1[1] == '\0') {
          uVar9 = (uint)(ushort)(*(ushort *)((long)puVar1 + 6) << 8 |
                                *(ushort *)((long)puVar1 + 6) >> 8);
          if (local_48 < uVar9 * 0x30 + 8) {
            uVar9 = (uint)((local_48 - 8) / 0x30);
          }
          face->sbit_num_strikes = uVar9;
          FVar5 = 0;
          bVar2 = true;
          goto joined_r0x00161833;
        }
        FVar5 = 3;
      }
      else {
        FVar5 = 2;
      }
    }
    bVar2 = false;
joined_r0x00161833:
    if (!bVar2) {
LAB_001617a1:
      if (FVar5 == 0) {
        return 0;
      }
      if (*pbytes != (FT_Byte *)0x0) {
        FT_Stream_ReleaseFrame(stream,pbytes);
      }
      face->sbit_table_size = 0;
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
      return FVar5;
    }
  }
  else if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
    FVar5 = FT_Stream_EnterFrame(stream,8);
    if (FVar5 == 0) {
      FVar3 = FT_Stream_GetUShort(stream);
      FVar4 = FT_Stream_GetUShort(stream);
      local_38 = FT_Stream_GetULong(stream);
      FT_Stream_ExitFrame(stream);
      if (FVar3 == 0) {
        FVar5 = 2;
      }
      else if (local_38 < 0x10000 && (FVar4 & 0xfffd) == 1) {
        uVar11 = local_48 + 0x3fffffff8 >> 2;
        if (local_38 * 4 + 8 <= local_48) {
          uVar11 = local_38;
        }
        FVar8 = FT_Stream_Pos(stream);
        FVar5 = FT_Stream_Seek(stream,FVar8 - 8);
        if (FVar5 == 0) {
          count = (ulong)((FT_UInt)uVar11 * 4 + 8);
          face->sbit_table_size = count;
          FVar6 = FT_Stream_ExtractFrame(stream,count,pbytes);
          FVar5 = 0;
          if (FVar6 == 0) {
            face->sbit_num_strikes = (FT_UInt)uVar11;
            bVar2 = true;
          }
          else {
            bVar2 = false;
            FVar5 = FVar6;
          }
          goto joined_r0x00161833;
        }
      }
      else {
        FVar5 = 3;
      }
    }
    bVar2 = false;
    goto joined_r0x00161833;
  }
  face->ebdt_start = 0;
  face->ebdt_size = 0;
  if (face->sbit_table_type != TT_SBIT_TABLE_TYPE_NONE) {
    if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
      face->ebdt_start = FVar7;
    }
    else {
      FVar5 = (*face->goto_table)(face,0x43424454,stream,&local_40);
      if (((FVar5 != 0) &&
          (FVar5 = (*face->goto_table)(face,0x45424454,stream,&local_40), FVar5 != 0)) &&
         (FVar5 = (*face->goto_table)(face,0x62646174,stream,&local_40), FVar5 != 0))
      goto LAB_0016193a;
      FVar7 = FT_Stream_Pos(stream);
      face->ebdt_start = FVar7;
      local_48 = local_40;
    }
    face->ebdt_size = local_48;
  }
LAB_0016193a:
  if (face->ebdt_size == 0) {
    face->sbit_num_strikes = 0;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_sbit( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  table_size;
    FT_ULong  table_start;


    face->sbit_table       = NULL;
    face->sbit_table_size  = 0;
    face->sbit_table_type  = TT_SBIT_TABLE_TYPE_NONE;
    face->sbit_num_strikes = 0;

    error = face->goto_table( face, TTAG_CBLC, stream, &table_size );
    if ( !error )
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_CBLC;
    else
    {
      error = face->goto_table( face, TTAG_EBLC, stream, &table_size );
      if ( error )
        error = face->goto_table( face, TTAG_bloc, stream, &table_size );
      if ( !error )
        face->sbit_table_type = TT_SBIT_TABLE_TYPE_EBLC;
    }

    if ( error )
    {
      error = face->goto_table( face, TTAG_sbix, stream, &table_size );
      if ( !error )
        face->sbit_table_type = TT_SBIT_TABLE_TYPE_SBIX;
    }
    if ( error )
      goto Exit;

    if ( table_size < 8 )
    {
      FT_ERROR(( "tt_face_load_sbit_strikes: table too short\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    table_start = FT_STREAM_POS();

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  p;
        FT_Fixed  version;
        FT_ULong  num_strikes;
        FT_UInt   count;


        if ( FT_FRAME_EXTRACT( table_size, face->sbit_table ) )
          goto Exit;

        face->sbit_table_size = table_size;

        p = face->sbit_table;

        version     = FT_NEXT_LONG( p );
        num_strikes = FT_NEXT_ULONG( p );

        /* there's at least one font (FZShuSong-Z01, version 3)   */
        /* that uses the wrong byte order for the `version' field */
        if ( ( (FT_ULong)version & 0xFFFF0000UL ) != 0x00020000UL &&
             ( (FT_ULong)version & 0x0000FFFFUL ) != 0x00000200UL &&
             ( (FT_ULong)version & 0xFFFF0000UL ) != 0x00030000UL &&
             ( (FT_ULong)version & 0x0000FFFFUL ) != 0x00000300UL )
        {
          error = FT_THROW( Unknown_File_Format );
          goto Exit;
        }

        if ( num_strikes >= 0x10000UL )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /*
         *  Count the number of strikes available in the table.  We are a bit
         *  paranoid there and don't trust the data.
         */
        count = (FT_UInt)num_strikes;
        if ( 8 + 48UL * count > table_size )
          count = (FT_UInt)( ( table_size - 8 ) / 48 );

        face->sbit_num_strikes = count;
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_UShort  version;
        FT_UShort  flags;
        FT_ULong   num_strikes;
        FT_UInt    count;


        if ( FT_FRAME_ENTER( 8 ) )
          goto Exit;

        version     = FT_GET_USHORT();
        flags       = FT_GET_USHORT();
        num_strikes = FT_GET_ULONG();

        FT_FRAME_EXIT();

        if ( version < 1 )
        {
          error = FT_THROW( Unknown_File_Format );
          goto Exit;
        }

        /* Bit 0 must always be `1'.                            */
        /* Bit 1 controls the overlay of bitmaps with outlines. */
        /* All other bits should be zero.                       */
        if ( !( flags == 1 || flags == 3 ) ||
             num_strikes >= 0x10000UL      )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* we currently don't support bit 1; however, it is better to */
        /* draw at least something...                                 */
        if ( flags == 3 )
          FT_TRACE1(( "tt_face_load_sbit_strikes:"
                      " sbix overlay not supported yet\n"
                      "                          "
                      " expect bad rendering results\n" ));

        /*
         *  Count the number of strikes available in the table.  We are a bit
         *  paranoid there and don't trust the data.
         */
        count = (FT_UInt)num_strikes;
        if ( 8 + 4UL * count > table_size )
          count = (FT_UInt)( ( table_size - 8 ) / 4 );

        if ( FT_STREAM_SEEK( FT_STREAM_POS() - 8 ) )
          goto Exit;

        face->sbit_table_size = 8 + count * 4;
        if ( FT_FRAME_EXTRACT( face->sbit_table_size, face->sbit_table ) )
          goto Exit;

        face->sbit_num_strikes = count;
      }
      break;

    default:
      /* we ignore unknown table formats */
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    if ( !error )
      FT_TRACE3(( "tt_face_load_sbit_strikes: found %u strikes\n",
                  face->sbit_num_strikes ));

    face->ebdt_start = 0;
    face->ebdt_size  = 0;

    if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX )
    {
      /* the `sbix' table is self-contained; */
      /* it has no associated data table     */
      face->ebdt_start = table_start;
      face->ebdt_size  = table_size;
    }
    else if ( face->sbit_table_type != TT_SBIT_TABLE_TYPE_NONE )
    {
      FT_ULong  ebdt_size;


      error = face->goto_table( face, TTAG_CBDT, stream, &ebdt_size );
      if ( error )
        error = face->goto_table( face, TTAG_EBDT, stream, &ebdt_size );
      if ( error )
        error = face->goto_table( face, TTAG_bdat, stream, &ebdt_size );

      if ( !error )
      {
        face->ebdt_start = FT_STREAM_POS();
        face->ebdt_size  = ebdt_size;
      }
    }

    if ( !face->ebdt_size )
    {
      FT_TRACE2(( "tt_face_load_sbit_strikes:"
                  " no embedded bitmap data table found;\n"
                  "                          "
                  " resetting number of strikes to zero\n" ));
      face->sbit_num_strikes = 0;
    }

    return FT_Err_Ok;

  Exit:
    if ( error )
    {
      if ( face->sbit_table )
        FT_FRAME_RELEASE( face->sbit_table );
      face->sbit_table_size = 0;
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
    }

    return error;
  }